

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_to_local_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::PrivateToLocalPass::MoveVariable
          (PrivateToLocalPass *this,Instruction *variable,Function *function)

{
  initializer_list<unsigned_int> init_list;
  uint32_t old_type_id;
  IRContext *pIVar1;
  reference block;
  Instruction *this_00;
  iterator local_a0;
  undefined1 local_90 [8];
  iterator local_88;
  undefined4 local_74;
  uint32_t local_70;
  undefined1 local_6c [4];
  uint32_t new_type_id;
  undefined8 local_60;
  SmallVector<unsigned_int,_2UL> local_58;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_30;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> var;
  Function *function_local;
  Instruction *variable_local;
  PrivateToLocalPass *this_local;
  
  var._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )function;
  utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList
            (&variable->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_30,variable);
  pIVar1 = Pass::context(&this->super_Pass);
  IRContext::ForgetUses(pIVar1,variable);
  local_6c = (undefined1  [4])0x7;
  _new_type_id = (Instruction *)local_6c;
  local_60._0_1_ = true;
  local_60._1_7_ = 0;
  init_list._M_len = 1;
  init_list._M_array = (iterator)_new_type_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
  opt::Instruction::SetInOperand(variable,0,&local_58);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  old_type_id = opt::Instruction::type_id(variable);
  local_70 = GetNewType(this,old_type_id);
  if (local_70 == 0) {
    this_local._7_1_ = false;
  }
  else {
    opt::Instruction::SetResultType(variable,local_70);
    pIVar1 = Pass::context(&this->super_Pass);
    IRContext::AnalyzeUses(pIVar1,variable);
    pIVar1 = Pass::context(&this->super_Pass);
    local_88 = opt::Function::begin
                         ((Function *)
                          var._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
    block = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*(&local_88);
    IRContext::set_instr_block(pIVar1,variable,block);
    local_a0 = opt::Function::begin
                         ((Function *)
                          var._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->(&local_a0);
    BasicBlock::begin((BasicBlock *)local_90);
    this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator->
                        ((iterator_template<spvtools::opt::Instruction> *)local_90);
    opt::Instruction::InsertBefore(this_00,&local_30);
    this_local._7_1_ = UpdateUses(this,variable);
  }
  local_74 = 1;
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_30);
  return this_local._7_1_;
}

Assistant:

bool PrivateToLocalPass::MoveVariable(Instruction* variable,
                                      Function* function) {
  // The variable needs to be removed from the global section, and placed in the
  // header of the function.  First step remove from the global list.
  variable->RemoveFromList();
  std::unique_ptr<Instruction> var(variable);  // Take ownership.
  context()->ForgetUses(variable);

  // Update the storage class of the variable.
  variable->SetInOperand(kVariableStorageClassInIdx,
                         {uint32_t(spv::StorageClass::Function)});

  // Update the type as well.
  uint32_t new_type_id = GetNewType(variable->type_id());
  if (new_type_id == 0) {
    return false;
  }
  variable->SetResultType(new_type_id);

  // Place the variable at the start of the first basic block.
  context()->AnalyzeUses(variable);
  context()->set_instr_block(variable, &*function->begin());
  function->begin()->begin()->InsertBefore(std::move(var));

  // Update uses where the type may have changed.
  return UpdateUses(variable);
}